

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

Matrix_t MatrixMultiply(int num,...)

{
  byte bVar1;
  undefined8 uVar2;
  char in_AL;
  uint uVar3;
  float *pfVar4;
  undefined8 in_RCX;
  long lVar5;
  float *pfVar6;
  byte bVar7;
  undefined8 in_RDX;
  ulong uVar8;
  ulong uVar9;
  undefined8 in_RSI;
  undefined8 *puVar10;
  ulong uVar11;
  undefined8 *puVar12;
  undefined8 in_R8;
  ulong uVar13;
  undefined8 in_R9;
  ulong uVar14;
  ulong uVar15;
  float *__ptr;
  undefined4 in_XMM0_Da;
  float fVar16;
  undefined4 in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  Matrix_t MVar17;
  va_list argp;
  Matrix_t mat_group [10];
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Da;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  puVar10 = (undefined8 *)&stack0x00000008;
  uVar3 = 8;
  lVar5 = 0;
  uVar8 = 0;
  if (0 < num) {
    uVar8 = (ulong)(uint)num;
  }
  for (; uVar8 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
    if (uVar3 < 0x21) {
      uVar11 = (ulong)uVar3;
      uVar3 = uVar3 + 0x10;
      puVar12 = (undefined8 *)((long)local_e8 + uVar11);
    }
    else {
      puVar12 = puVar10;
      puVar10 = puVar10 + 2;
    }
    uVar2 = puVar12[1];
    *(undefined8 *)((long)&mat_group[0].pMatrix + lVar5) = *puVar12;
    *(undefined8 *)(&mat_group[0].row + lVar5) = uVar2;
  }
  if (num < 2) {
    puts("ERROR: Martixs not enough!");
    __ptr = (float *)0x0;
    uVar8 = 0;
  }
  else {
    __ptr = mat_group[0].pMatrix;
    bVar7 = mat_group[0].column;
    for (uVar8 = 1; uVar8 != (uint)num; uVar8 = uVar8 + 1) {
      if (mat_group[uVar8 - 1].column != mat_group[uVar8].row) {
        puts("ERROR: Martixs sizes don\'t match!");
      }
      bVar1 = mat_group[uVar8].column;
      uVar11 = (ulong)bVar1;
      pfVar4 = (float *)malloc((ulong)mat_group[0].row * 4 * uVar11);
      if (pfVar4 == (float *)0x0) {
        printf("ERROR: Malloc failed!-00");
      }
      pfVar6 = __ptr;
      for (uVar9 = 0; uVar9 != mat_group[0].row; uVar9 = uVar9 + 1) {
        for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
          fVar16 = 0.0;
          uVar13 = uVar15;
          for (uVar14 = 0; bVar7 != uVar14; uVar14 = uVar14 + 1) {
            fVar16 = fVar16 + pfVar6[uVar14] * mat_group[uVar8].pMatrix[uVar13];
            uVar13 = uVar13 + uVar11;
          }
          pfVar4[uVar9 * uVar11 + uVar15] = fVar16;
        }
        pfVar6 = pfVar6 + bVar7;
      }
      if (uVar8 != 1) {
        free(__ptr);
      }
      __ptr = pfVar4;
      bVar7 = bVar1;
    }
    uVar8 = (ulong)(uint6)mat_group[0]._10_6_ << 0x10 | (ulong)bVar7 << 8 | (ulong)mat_group[0].row;
  }
  MVar17.row = (char)uVar8;
  MVar17.column = (char)(uVar8 >> 8);
  MVar17._10_6_ = (int6)(uVar8 >> 0x10);
  MVar17.pMatrix = __ptr;
  return MVar17;
}

Assistant:

Matrix_t MatrixMultiply(int num, ...)
{
	int i;
	float sum = 0;
	uint8_t c, r, k;
	Matrix_t mat_group[MATRIX_MAX_MULTIPLY];
	Matrix_t mat_res;
	Matrix_t mat_temp;
	Matrix_t mat_err = {NULL, 0, 0};

	va_list argp;
	va_start(argp, num);
	for (i = 0; i < num; i++)
	{
		mat_group[i] = va_arg(argp, Matrix_t);
	}
	va_end(argp);

	if (num < 2)
	{
		printf("ERROR: Martixs not enough!\n");
		return mat_err;
	}
	else
	{
		mat_res = mat_group[0];
		for (i = 1; i < num; i++)
		{
			if (mat_group[i - 1].column != mat_group[i].row)
			{
				printf("ERROR: Martixs sizes don't match!\n");
			}
			mat_temp.row = mat_res.row;
			mat_temp.column = mat_group[i].column;
			mat_temp.pMatrix = (float *)malloc(sizeof(float) * mat_temp.row * mat_temp.column); //注意有无内存泄漏
			if (mat_temp.pMatrix == NULL)
				printf("ERROR: Malloc failed!-00");
			for (r = 0; r < mat_res.row; r++)
			{
				for (c = 0; c < mat_group[i].column; c++)
				{
					for (k = 0; k < mat_res.column; k++)
					{
						sum = sum + *(mat_res.pMatrix + mat_res.column * r + k) * *(mat_group[i].pMatrix + k * mat_group[i].column + c);
					}
					*(mat_temp.pMatrix + r * mat_temp.column + c) = sum;
					sum = 0;
				}
			}
			if (i != 1)
				free(mat_res.pMatrix);
			mat_res = mat_temp;
		}
		//Martix_display(mat_temp);
	}
	return mat_res;
}